

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Ptr_t * Aig_Support(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vSupp_00;
  Vec_Ptr_t *vSupp;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                  ,0x351,"Vec_Ptr_t *Aig_Support(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsCo(pObj);
  if (iVar1 == 0) {
    Aig_ManIncrementTravId(p);
    vSupp_00 = Vec_PtrAlloc(100);
    Aig_Support_rec(p,pObj,vSupp_00);
    return vSupp_00;
  }
  __assert_fail("!Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                ,0x352,"Vec_Ptr_t *Aig_Support(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Aig_Support( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vSupp;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCo(pObj) );
    Aig_ManIncrementTravId( p );
    vSupp = Vec_PtrAlloc( 100 );
    Aig_Support_rec( p, pObj, vSupp );
    return vSupp;
}